

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontAtlas::GetTexDataAsRGBA32
          (ImFontAtlas *this,uchar **out_pixels,int *out_width,int *out_height,
          int *out_bytes_per_pixel)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uchar *puVar5;
  
  if (this->TexPixelsRGBA32 == (uint *)0x0) {
    puVar5 = this->TexPixelsAlpha8;
    if (puVar5 == (uchar *)0x0) {
      Build(this);
      puVar5 = this->TexPixelsAlpha8;
      if (puVar5 == (uchar *)0x0) goto LAB_002065b0;
    }
    puVar1 = (uint *)ImGui::MemAlloc((long)this->TexHeight * (long)this->TexWidth * 4);
    this->TexPixelsRGBA32 = puVar1;
    iVar2 = this->TexHeight * this->TexWidth;
    if (0 < iVar2) {
      uVar3 = iVar2 + 1;
      lVar4 = 0;
      do {
        puVar1[lVar4] = (uint)puVar5[lVar4] << 0x18 | 0xffffff;
        uVar3 = uVar3 - 1;
        lVar4 = lVar4 + 1;
      } while (1 < uVar3);
    }
  }
LAB_002065b0:
  *out_pixels = (uchar *)this->TexPixelsRGBA32;
  if (out_width != (int *)0x0) {
    *out_width = this->TexWidth;
  }
  if (out_height != (int *)0x0) {
    *out_height = this->TexHeight;
  }
  if (out_bytes_per_pixel != (int *)0x0) {
    *out_bytes_per_pixel = 4;
  }
  return;
}

Assistant:

void    ImFontAtlas::GetTexDataAsRGBA32(unsigned char** out_pixels, int* out_width, int* out_height, int* out_bytes_per_pixel)
{
    // Convert to RGBA32 format on demand
    // Although it is likely to be the most commonly used format, our font rendering is 1 channel / 8 bpp
    if (!TexPixelsRGBA32)
    {
        unsigned char* pixels = NULL;
        GetTexDataAsAlpha8(&pixels, NULL, NULL);
        if (pixels)
        {
            TexPixelsRGBA32 = (unsigned int*)IM_ALLOC((size_t)TexWidth * (size_t)TexHeight * 4);
            const unsigned char* src = pixels;
            unsigned int* dst = TexPixelsRGBA32;
            for (int n = TexWidth * TexHeight; n > 0; n--)
                *dst++ = IM_COL32(255, 255, 255, (unsigned int)(*src++));
        }
    }

    *out_pixels = (unsigned char*)TexPixelsRGBA32;
    if (out_width) *out_width = TexWidth;
    if (out_height) *out_height = TexHeight;
    if (out_bytes_per_pixel) *out_bytes_per_pixel = 4;
}